

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIteratorNext(WalIterator *p,u32 *piPage,u32 *piFrame)

{
  uint uVar1;
  uint uVar2;
  WalSegment *pWVar3;
  u32 iPg;
  WalSegment *pSegment;
  uint local_28;
  int i;
  u32 iRet;
  u32 iMin;
  u32 *piFrame_local;
  u32 *piPage_local;
  WalIterator *p_local;
  
  local_28 = 0xffffffff;
  uVar1 = p->iPrior;
  pSegment._4_4_ = p->nSegment;
  do {
    pSegment._4_4_ = pSegment._4_4_ + -1;
    if (pSegment._4_4_ < 0) {
      p->iPrior = local_28;
      *piPage = local_28;
      return (int)(local_28 == 0xffffffff);
    }
    pWVar3 = p->aSegment + pSegment._4_4_;
    while (pWVar3->iNext < pWVar3->nEntry) {
      uVar2 = pWVar3->aPgno[pWVar3->aIndex[pWVar3->iNext]];
      if (uVar1 < uVar2) {
        if (uVar2 < local_28) {
          *piFrame = pWVar3->iZero + (uint)pWVar3->aIndex[pWVar3->iNext];
          local_28 = uVar2;
        }
        break;
      }
      pWVar3->iNext = pWVar3->iNext + 1;
    }
  } while( true );
}

Assistant:

static int walIteratorNext(
  WalIterator *p,               /* Iterator */
  u32 *piPage,                  /* OUT: The page number of the next page */
  u32 *piFrame                  /* OUT: Wal frame index of next page */
){
  u32 iMin;                     /* Result pgno must be greater than iMin */
  u32 iRet = 0xFFFFFFFF;        /* 0xffffffff is never a valid page number */
  int i;                        /* For looping through segments */

  iMin = p->iPrior;
  assert( iMin<0xffffffff );
  for(i=p->nSegment-1; i>=0; i--){
    struct WalSegment *pSegment = &p->aSegment[i];
    while( pSegment->iNext<pSegment->nEntry ){
      u32 iPg = pSegment->aPgno[pSegment->aIndex[pSegment->iNext]];
      if( iPg>iMin ){
        if( iPg<iRet ){
          iRet = iPg;
          *piFrame = pSegment->iZero + pSegment->aIndex[pSegment->iNext];
        }
        break;
      }
      pSegment->iNext++;
    }
  }

  *piPage = p->iPrior = iRet;
  return (iRet==0xFFFFFFFF);
}